

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O0

bool duckdb::
     TemplatedDecimalScaleUp<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::Hugeint,duckdb::Hugeint>
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  hugeint_t factor_p;
  hugeint_t factor_p_00;
  hugeint_t limit_p;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  Vector *in_RCX;
  long lVar7;
  int64_t extraout_RDX;
  Vector *in_RSI;
  Vector *in_RDI;
  uint uVar8;
  hugeint_t hVar9;
  hugeint_t in;
  DecimalScaleInput<duckdb::hugeint_t,_duckdb::hugeint_t> input_1;
  hugeint_t limit;
  DecimalScaleInput<duckdb::hugeint_t,_duckdb::hugeint_t> input;
  idx_t target_width;
  hugeint_t multiply_factor;
  idx_t scale_difference;
  uint8_t result_width;
  uint8_t result_scale;
  uint8_t source_width;
  uint8_t source_scale;
  void *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  Vector *in_stack_fffffffffffffec0;
  uint64_t in_stack_fffffffffffffec8;
  int64_t in_stack_fffffffffffffed0;
  CastParameters *in_stack_fffffffffffffee0;
  uint8_t in_stack_fffffffffffffee8;
  uint8_t in_stack_fffffffffffffef0;
  byte local_108;
  uint64_t local_c8;
  Vector *local_48;
  bool local_1;
  
  Vector::GetType(in_RDI);
  bVar1 = DecimalType::GetScale
                    ((LogicalType *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  Vector::GetType(in_RDI);
  bVar2 = DecimalType::GetWidth
                    ((LogicalType *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  Vector::GetType(in_RSI);
  bVar3 = DecimalType::GetScale
                    ((LogicalType *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  Vector::GetType(in_RSI);
  bVar4 = DecimalType::GetWidth
                    ((LogicalType *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  lVar7 = (long)(int)((uint)bVar3 - (uint)bVar1) * 0x10;
  hVar9.upper = extraout_RDX;
  hVar9.lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + lVar7 + 8);
  hVar9 = UnsafeNumericCast<duckdb::hugeint_t,duckdb::hugeint_t,void>
                    (*(duckdb **)(Hugeint::POWERS_OF_TEN + lVar7),hVar9);
  in.upper = hVar9.upper;
  uVar6 = (ulong)bVar4 - (long)(int)((uint)bVar3 - (uint)bVar1);
  local_48 = (Vector *)hVar9.lower;
  if (bVar2 < uVar6) {
    factor_p_00.upper = in_stack_fffffffffffffed0;
    factor_p_00.lower = in_stack_fffffffffffffec8;
    DecimalScaleInput<duckdb::hugeint_t,_duckdb::hugeint_t>::DecimalScaleInput
              ((DecimalScaleInput<duckdb::hugeint_t,_duckdb::hugeint_t> *)in_stack_fffffffffffffec0,
               (Vector *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),factor_p_00,
               (CastParameters *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    UnaryExecutor::
    GenericExecute<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::DecimalScaleUpOperator>
              (in_stack_fffffffffffffec0,
               (Vector *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               in_stack_fffffffffffffea8,false);
    local_1 = true;
  }
  else {
    lVar7 = uVar6 * 0x10;
    in.lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + lVar7 + 8);
    hVar9 = UnsafeNumericCast<duckdb::hugeint_t,duckdb::hugeint_t,void>
                      (*(duckdb **)(Hugeint::POWERS_OF_TEN + lVar7),in);
    local_c8 = hVar9.lower;
    uVar8 = (uint)bVar2;
    uVar5 = (uint)bVar1;
    limit_p.upper = local_c8;
    limit_p.lower = in.upper;
    factor_p.lower._4_4_ = in_stack_fffffffffffffebc;
    factor_p.lower._0_4_ = uVar5;
    factor_p.upper = (int64_t)local_48;
    DecimalScaleInput<duckdb::hugeint_t,_duckdb::hugeint_t>::DecimalScaleInput
              ((DecimalScaleInput<duckdb::hugeint_t,_duckdb::hugeint_t> *)
               CONCAT44(in_stack_fffffffffffffeb4,uVar8),in_RCX,limit_p,factor_p,
               in_stack_fffffffffffffee0,in_stack_fffffffffffffee8,in_stack_fffffffffffffef0);
    UnaryExecutor::
    GenericExecute<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::DecimalScaleUpCheckOperator>
              (local_48,(Vector *)CONCAT44(in_stack_fffffffffffffebc,uVar5),
               CONCAT44(in_stack_fffffffffffffeb4,uVar8),in_RCX,false);
    local_1 = (bool)(local_108 & 1);
  }
  return local_1;
}

Assistant:

bool TemplatedDecimalScaleUp(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto source_scale = DecimalType::GetScale(source.GetType());
	auto source_width = DecimalType::GetWidth(source.GetType());
	auto result_scale = DecimalType::GetScale(result.GetType());
	auto result_width = DecimalType::GetWidth(result.GetType());
	D_ASSERT(result_scale >= source_scale);
	idx_t scale_difference = result_scale - source_scale;
	DEST multiply_factor = UnsafeNumericCast<DEST>(POWERS_DEST::POWERS_OF_TEN[scale_difference]);
	idx_t target_width = result_width - scale_difference;
	if (source_width < target_width) {
		DecimalScaleInput<SOURCE, DEST> input(result, multiply_factor, parameters);
		// type will always fit: no need to check limit
		UnaryExecutor::GenericExecute<SOURCE, DEST, DecimalScaleUpOperator>(source, result, count, &input);
		return true;
	} else {
		// type might not fit: check limit
		auto limit = UnsafeNumericCast<SOURCE>(POWERS_SOURCE::POWERS_OF_TEN[target_width]);
		DecimalScaleInput<SOURCE, DEST> input(result, limit, multiply_factor, parameters, source_width, source_scale);
		UnaryExecutor::GenericExecute<SOURCE, DEST, DecimalScaleUpCheckOperator>(source, result, count, &input,
		                                                                         parameters.error_message);
		return input.vector_cast_data.all_converted;
	}
}